

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O0

void __thiscall
QGridLayoutEngine::QGridLayoutEngine
          (QGridLayoutEngine *this,Alignment defaultAlignment,bool snapToPixelGrid)

{
  long lVar1;
  byte bVar2;
  byte in_DL;
  Int in_ESI;
  QGridLayoutEngine *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  QList<QGridLayoutItem_*>::QList((QList<QGridLayoutItem_*> *)0x8a4605);
  QList<QGridLayoutItem_*>::QList((QList<QGridLayoutItem_*> *)0x8a4612);
  QHVContainer<QLayoutParameter<double>_>::QHVContainer
            ((QHVContainer<QLayoutParameter<double>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QHVContainer<QGridLayoutRowInfo>::QHVContainer
            ((QHVContainer<QGridLayoutRowInfo> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x8a463c);
  QHVContainer<QGridLayoutBox>::QHVContainer
            ((QHVContainer<QGridLayoutBox> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QGridLayoutRowData::QGridLayoutRowData
            ((QGridLayoutRowData *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
  QGridLayoutRowData::QGridLayoutRowData
            ((QGridLayoutRowData *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
  QSizeF::QSizeF(&in_RDI->q_cachedSize);
  QList<double>::QList((QList<double> *)0x8a468c);
  QList<double>::QList((QList<double> *)0x8a469c);
  QList<double>::QList((QList<double> *)0x8a46ac);
  QList<double>::QList((QList<double> *)0x8a46bc);
  QList<double>::QList((QList<double> *)0x8a46cc);
  in_RDI->m_visualDirection = LeftToRight;
  (in_RDI->m_defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = in_ESI;
  in_RDI->field_0x128 = in_RDI->field_0x128 & 0xfe | bVar2 & 1;
  in_RDI->field_0x128 = in_RDI->field_0x128 & 0xfd;
  in_RDI->field_0x128 = in_RDI->field_0x128 & 0xfb;
  invalidate(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGridLayoutEngine::QGridLayoutEngine(Qt::Alignment defaultAlignment, bool snapToPixelGrid)
{
    m_visualDirection = Qt::LeftToRight;
    m_defaultAlignment = defaultAlignment;
    m_snapToPixelGrid = snapToPixelGrid;
    m_uniformCellWidths = false;
    m_uniformCellHeights = false;
    invalidate();
}